

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture2D_GL.cpp
# Opt level: O3

void __thiscall
Diligent::Texture2D_GL::UpdateData
          (Texture2D_GL *this,GLContextState *ContextState,Uint32 MipLevel,Uint32 Slice,Box *DstBox,
          TextureSubResData *SubresData)

{
  Uint32 UVar1;
  Uint32 UVar2;
  GLenum GVar3;
  GLenum GVar4;
  IBuffer *pSrcPtr;
  PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC p_Var5;
  uint uVar6;
  int iVar7;
  TextureFormatAttribs *pTVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  BufferGLImpl *pBufferGL;
  uint uVar12;
  GLuint GVar13;
  TextureSubResData *pTVar14;
  ulong uVar15;
  NativePixelAttribs NVar16;
  undefined4 uStack_88;
  Uint32 BlockBytesInRow;
  string msg;
  
  TextureBaseGL::UpdateData
            (&this->super_TextureBaseGL,ContextState,MipLevel,Slice,DstBox,SubresData);
  GLContextState::BindTexture
            (ContextState,-1,(this->super_TextureBaseGL).m_BindTarget,
             &(this->super_TextureBaseGL).m_GlTexture);
  pSrcPtr = SubresData->pSrcBuffer;
  if (pSrcPtr == (IBuffer *)0x0) {
    GVar13 = 0;
  }
  else {
    CheckDynamicType<Diligent::BufferGLImpl,Diligent::IBuffer>(pSrcPtr);
    GVar13 = *(GLuint *)((long)&pSrcPtr[0x11].super_IDeviceObject.super_IObject._vptr_IObject + 4);
  }
  (*__glewBindBuffer)(0x88ec,GVar13);
  NVar16 = GetNativePixelTransferAttribs
                     ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  glPixelStorei(0xcf5,4);
  glPixelStorei(0xcf4,0);
  glPixelStorei(0xcf3,0);
  if (((undefined1  [12])NVar16 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    pTVar8 = GetTextureFormatAttribs
                       ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.Format);
    uVar15 = (ulong)pTVar8->ComponentSize * (ulong)pTVar8->NumComponents;
    uVar10 = SubresData->Stride;
    if (uVar10 % uVar15 != 0) {
      FormatString<char[42]>(&msg,(char (*) [42])"Data stride is not multiple of pixel size");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0x100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      uVar10 = SubresData->Stride;
    }
    msg._M_dataplus._M_p = (pointer)(uVar10 / uVar15);
    iVar7 = StaticCast<int,unsigned_long>((unsigned_long *)&msg);
    glPixelStorei(0xcf2,iVar7);
    glTexSubImage2D();
  }
  else {
    uVar12 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
             .m_Desc.Width >> ((byte)MipLevel & 0x1f);
    uVar12 = uVar12 + (uVar12 == 0);
    uVar11 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
             .m_Desc.Height >> ((byte)MipLevel & 0x1f);
    uVar11 = uVar11 + (uVar11 == 0);
    if (((((DstBox->MinX & 3) != 0) || ((DstBox->MinY & 3) != 0)) ||
        (DstBox->MaxX != uVar12 && (DstBox->MaxX & 3) != 0)) ||
       (DstBox->MaxY != uVar11 && (DstBox->MaxY & 3) != 0)) {
      FormatString<char[57]>
                (&msg,(char (*) [57])"Compressed texture update region must be 4 pixel-aligned");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0xd9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    pTVar8 = GetTextureFormatAttribs
                       ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.Format);
    BlockBytesInRow = (uint)pTVar8->ComponentSize * ((DstBox->MaxX - DstBox->MinX) + 3 >> 2);
    if (SubresData->Stride != (ulong)BlockBytesInRow) {
      FormatString<char[25],unsigned_long,char[53],unsigned_int,char[2]>
                (&msg,(Diligent *)"Compressed data stride (",(char (*) [25])&SubresData->Stride,
                 (unsigned_long *)" must match the size of a row of compressed blocks (",
                 (char (*) [53])&BlockBytesInRow,(uint *)0x920060,
                 (char (*) [2])CONCAT44(BlockBytesInRow,uStack_88));
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0xdf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    glPixelStorei(0xcf2,0);
    p_Var5 = __glewCompressedTexSubImage2D;
    UVar1 = DstBox->MinX;
    uVar6 = DstBox->MaxX - UVar1;
    UVar2 = DstBox->MinY;
    uVar9 = DstBox->MaxY - UVar2;
    uVar12 = uVar12 - UVar1;
    if (uVar6 <= uVar12) {
      uVar12 = uVar6;
    }
    uVar11 = uVar11 - UVar2;
    if (uVar9 <= uVar11) {
      uVar11 = uVar9;
    }
    GVar3 = (this->super_TextureBaseGL).m_BindTarget;
    GVar4 = (this->super_TextureBaseGL).m_GLTexFormat;
    msg._M_dataplus._M_p = (pointer)((ulong)(uVar9 + 3 >> 2) * SubresData->Stride);
    iVar7 = StaticCast<int,unsigned_long>((unsigned_long *)&msg);
    pTVar14 = (TextureSubResData *)&SubresData->SrcOffset;
    if (SubresData->pSrcBuffer == (IBuffer *)0x0) {
      pTVar14 = SubresData;
    }
    (*p_Var5)(GVar3,MipLevel,UVar1,UVar2,uVar12,uVar11,GVar4,iVar7,pTVar14->pData);
  }
  BlockBytesInRow = glGetError();
  if (BlockBytesInRow != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
               ,0x10e,(char (*) [31])"Failed to update subimage data",
               (char (*) [17])"\nGL Error Code: ",&BlockBytesInRow);
    FormatString<char[6]>(&msg,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
               ,0x10e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (GVar13 != 0) {
    (*__glewBindBuffer)(0x88ec,0);
  }
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length._0_4_ = 0;
  GLContextState::BindTexture
            (ContextState,-1,(this->super_TextureBaseGL).m_BindTarget,(GLTextureObj *)&msg);
  if ((Uint32)msg._M_dataplus._M_p != 0) {
    BlockBytesInRow = (Uint32)msg._M_dataplus._M_p;
    if (msg._M_dataplus._M_p._4_4_ == 0) {
      glDeleteTextures(1,&BlockBytesInRow);
    }
  }
  return;
}

Assistant:

void Texture2D_GL::UpdateData(GLContextState&          ContextState,
                              Uint32                   MipLevel,
                              Uint32                   Slice,
                              const Box&               DstBox,
                              const TextureSubResData& SubresData)
{
    TextureBaseGL::UpdateData(ContextState, MipLevel, Slice, DstBox, SubresData);

    ContextState.BindTexture(-1, m_BindTarget, m_GlTexture);

    // Bind buffer if it is provided; copy from CPU memory otherwise
    GLuint UnpackBuffer = 0;
    if (SubresData.pSrcBuffer != nullptr)
    {
        auto* pBufferGL = ClassPtrCast<BufferGLImpl>(SubresData.pSrcBuffer);
        UnpackBuffer    = pBufferGL->GetGLHandle();
    }

    // Transfers to OpenGL memory are called unpack operations
    // If there is a buffer bound to GL_PIXEL_UNPACK_BUFFER target, then all the pixel transfer
    // operations will be performed from this buffer.
    glBindBuffer(GL_PIXEL_UNPACK_BUFFER, UnpackBuffer);

    const auto& TransferAttribs = GetNativePixelTransferAttribs(m_Desc.Format);

    glPixelStorei(GL_UNPACK_ALIGNMENT, PBOOffsetAlignment);
    glPixelStorei(GL_UNPACK_SKIP_PIXELS, 0);
    glPixelStorei(GL_UNPACK_SKIP_ROWS, 0);

    if (TransferAttribs.IsCompressed)
    {
        auto MipWidth  = std::max(m_Desc.Width >> MipLevel, 1U);
        auto MipHeight = std::max(m_Desc.Height >> MipLevel, 1U);
        VERIFY((DstBox.MinX % 4) == 0 && (DstBox.MinY % 4) == 0 &&
                   ((DstBox.MaxX % 4) == 0 || DstBox.MaxX == MipWidth) &&
                   ((DstBox.MaxY % 4) == 0 || DstBox.MaxY == MipHeight),
               "Compressed texture update region must be 4 pixel-aligned");
#ifdef DILIGENT_DEBUG
        {
            const auto& FmtAttribs      = GetTextureFormatAttribs(m_Desc.Format);
            auto        BlockBytesInRow = ((DstBox.Width() + 3) / 4) * Uint32{FmtAttribs.ComponentSize};
            VERIFY(SubresData.Stride == BlockBytesInRow,
                   "Compressed data stride (", SubresData.Stride, " must match the size of a row of compressed blocks (", BlockBytesInRow, ")");
        }
#endif

        glPixelStorei(GL_UNPACK_ROW_LENGTH, 0); // Must be 0 on WebGL
        //glPixelStorei(GL_UNPACK_COMPRESSED_BLOCK_WIDTH, 0);
        auto UpdateRegionWidth  = DstBox.Width();
        auto UpdateRegionHeight = DstBox.Height();
        UpdateRegionWidth       = std::min(UpdateRegionWidth, MipWidth - DstBox.MinX);
        UpdateRegionHeight      = std::min(UpdateRegionHeight, MipHeight - DstBox.MinY);
        glCompressedTexSubImage2D(m_BindTarget, MipLevel,
                                  DstBox.MinX,
                                  DstBox.MinY,
                                  UpdateRegionWidth,
                                  UpdateRegionHeight,
                                  // The format must be the same compressed-texture format previously
                                  // specified by glTexStorage2D() (thank you OpenGL for another useless
                                  // parameter that is nothing but the source of confusion), otherwise
                                  // INVALID_OPERATION error is generated.
                                  m_GLTexFormat,
                                  // An INVALID_VALUE error is generated if imageSize is not consistent with
                                  // the format, dimensions, and contents of the compressed image( too little or
                                  // too much data ),
                                  StaticCast<GLsizei>(((DstBox.Height() + 3) / 4) * SubresData.Stride),
                                  // If a non-zero named buffer object is bound to the GL_PIXEL_UNPACK_BUFFER target, 'data' is treated
                                  // as a byte offset into the buffer object's data store.
                                  // https://www.khronos.org/registry/OpenGL-Refpages/gl4/html/glCompressedTexSubImage2D.xhtml
                                  SubresData.pSrcBuffer != nullptr ? reinterpret_cast<void*>(StaticCast<size_t>(SubresData.SrcOffset)) : SubresData.pData);
    }
    else
    {
        const auto& TexFmtInfo = GetTextureFormatAttribs(m_Desc.Format);
        const auto  PixelSize  = Uint32{TexFmtInfo.NumComponents} * Uint32{TexFmtInfo.ComponentSize};
        VERIFY((SubresData.Stride % PixelSize) == 0, "Data stride is not multiple of pixel size");
        glPixelStorei(GL_UNPACK_ROW_LENGTH, StaticCast<GLint>(SubresData.Stride / PixelSize));

        glTexSubImage2D(m_BindTarget, MipLevel,
                        DstBox.MinX,
                        DstBox.MinY,
                        DstBox.Width(),
                        DstBox.Height(),
                        TransferAttribs.PixelFormat, TransferAttribs.DataType,
                        // If a non-zero named buffer object is bound to the GL_PIXEL_UNPACK_BUFFER target, 'data' is treated
                        // as a byte offset into the buffer object's data store.
                        // https://www.khronos.org/registry/OpenGL-Refpages/gl4/html/glTexSubImage2D.xhtml
                        SubresData.pSrcBuffer != nullptr ? reinterpret_cast<void*>(StaticCast<size_t>(SubresData.SrcOffset)) : SubresData.pData);
    }
    DEV_CHECK_GL_ERROR("Failed to update subimage data");

    if (UnpackBuffer != 0)
        glBindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);

    ContextState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}